

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O3

GLuint __thiscall
gl4cts::GPUShaderFP64Test2::getRequiredComponentsNumber
          (GPUShaderFP64Test2 *this,uniformTypeDetails *uniform_type)

{
  GLuint GVar1;
  int iVar2;
  
  GVar1 = uniform_type->m_n_rows;
  if (uniform_type->m_n_columns == 1) {
    return GVar1 * 2;
  }
  iVar2 = 8;
  if (GVar1 != 3) {
    iVar2 = GVar1 * 2;
  }
  return iVar2 * uniform_type->m_n_columns;
}

Assistant:

glw::GLuint GPUShaderFP64Test2::getRequiredComponentsNumber(const uniformTypeDetails& uniform_type) const
{
	static const glw::GLuint type_size	 = 2; /* double takes 2 N */
	const glw::GLuint		 column_length = uniform_type.m_n_rows;

	if (1 == uniform_type.m_n_columns)
	{
		return type_size * column_length;
	}
	else
	{
		const glw::GLuint alignment = type_size * ((3 == column_length) ? 4 : column_length);

		return alignment * uniform_type.m_n_columns;
	}
}